

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_symbols.cxx
# Opt level: O2

void draw_round_arrow(Fl_Color c,float da)

{
  long lVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double local_58;
  
  for (iVar2 = 0; iVar2 != 2; iVar2 = iVar2 + 1) {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,c);
    if (iVar2 == 0) {
      lVar1 = 0x130;
    }
    else {
      set_outline_color(c);
      lVar1 = 0xd0;
    }
    (**(code **)((long)(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device + lVar1))();
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(0xbfb999999999999a,0);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(0xbff0000000000000,0);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(0xbff0000000000000);
    local_58 = 1.0;
    dVar6 = 140.0;
    for (iVar3 = -0x1b; iVar3 != 0; iVar3 = iVar3 + 1) {
      dVar4 = (dVar6 / 180.0) * 3.141592653589793;
      dVar5 = cos(dVar4);
      dVar4 = sin(dVar4);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
                (dVar5 * local_58,dVar4 * local_58);
      dVar6 = dVar6 - (double)da;
      local_58 = local_58 + -0.005;
    }
    for (iVar3 = 0x1b; -1 < iVar3; iVar3 = iVar3 + -1) {
      dVar4 = (dVar6 / 180.0) * 3.141592653589793;
      dVar5 = cos(dVar4);
      dVar4 = sin(dVar4);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
                (dVar5 * local_58,dVar4 * local_58);
      dVar6 = dVar6 + (double)da;
      local_58 = local_58 + -0.015;
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[(ulong)(iVar2 == 0) * 4 + 0x24])();
  }
  return;
}

Assistant:

static void draw_round_arrow(Fl_Color c, float da=5.0) {
  double a, r, dr1=0.005, dr2=0.015;
  int i, j;
  for (j=0; j<2; j++) {
    if (j&1) {
      fl_color(c);
      set_outline_color(c);
      BC;
    } else {
      fl_color(c);
      BCP;
    }
    vv(-0.1, 0.0);
    vv(-1.0, 0.0);
    vv(-1.0, 0.9);
    for (i=27, a=140.0, r=1.0; i>0; i--, a-=da, r-=dr1) {
      double ar = a/180.0 * M_PI;
      vv(cos(ar)*r, sin(ar)*r);
    }
    for (i=27; i>=0; a+=da, i--, r-=dr2) {
      double ar = a/180.0 * M_PI;
      vv(cos(ar)*r, sin(ar)*r);
    }
    if (j&1) {
      EC;
    } else {
      ECP;
    }
  }
}